

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_dist_to_tri(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *distance)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_168;
  double local_160;
  double local_158;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c0;
  REF_DBL local_88;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT edge_nodes [2];
  REF_DBL node_dist2;
  REF_DBL node_dist1;
  REF_DBL node_dist0;
  REF_DBL edge_dist2;
  REF_DBL edge_dist1;
  REF_DBL edge_dist0;
  REF_DBL projection;
  REF_DBL *distance_local;
  REF_DBL *xyz_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  projection = (REF_DBL)distance;
  distance_local = xyz;
  xyz_local = (REF_DBL *)nodes;
  nodes_local = &ref_node->n;
  uVar1 = ref_node_tri_projection(ref_node,nodes,xyz,&edge_dist0);
  if (uVar1 == 0) {
    if (edge_dist0 <= 0.0) {
      local_88 = -edge_dist0;
    }
    else {
      local_88 = edge_dist0;
    }
    edge_dist0 = local_88;
    ref_private_macro_code_rss_1 = *(REF_STATUS *)((long)xyz_local + 4);
    ref_private_macro_code_rss = *(REF_STATUS *)(xyz_local + 1);
    uVar1 = ref_node_dist_to_edge
                      ((REF_NODE)nodes_local,&ref_private_macro_code_rss_1,distance_local,
                       &edge_dist1);
    if (uVar1 == 0) {
      ref_private_macro_code_rss_1 = *(REF_STATUS *)(xyz_local + 1);
      ref_private_macro_code_rss = *(REF_STATUS *)xyz_local;
      uVar1 = ref_node_dist_to_edge
                        ((REF_NODE)nodes_local,&ref_private_macro_code_rss_1,distance_local,
                         &edge_dist2);
      if (uVar1 == 0) {
        ref_private_macro_code_rss_1 = *(REF_STATUS *)xyz_local;
        ref_private_macro_code_rss = *(REF_STATUS *)((long)xyz_local + 4);
        uVar1 = ref_node_dist_to_edge
                          ((REF_NODE)nodes_local,&ref_private_macro_code_rss_1,distance_local,
                           &node_dist0);
        if (uVar1 == 0) {
          dVar2 = pow(*distance_local -
                      *(double *)
                       (*(long *)(nodes_local + 0xe) + (long)(*(int *)xyz_local * 0xf) * 8),2.0);
          dVar3 = pow(distance_local[1] -
                      *(double *)
                       (*(long *)(nodes_local + 0xe) + (long)(*(int *)xyz_local * 0xf + 1) * 8),2.0)
          ;
          local_160 = pow(distance_local[2] -
                          *(double *)
                           (*(long *)(nodes_local + 0xe) + (long)(*(int *)xyz_local * 0xf + 2) * 8),
                          2.0);
          local_160 = dVar2 + dVar3 + local_160;
          dVar2 = pow(*distance_local -
                      *(double *)
                       (*(long *)(nodes_local + 0xe) +
                       (long)(*(int *)((long)xyz_local + 4) * 0xf) * 8),2.0);
          dVar3 = pow(distance_local[1] -
                      *(double *)
                       (*(long *)(nodes_local + 0xe) +
                       (long)(*(int *)((long)xyz_local + 4) * 0xf + 1) * 8),2.0);
          dVar4 = pow(distance_local[2] -
                      *(double *)
                       (*(long *)(nodes_local + 0xe) +
                       (long)(*(int *)((long)xyz_local + 4) * 0xf + 2) * 8),2.0);
          dVar4 = dVar2 + dVar3 + dVar4;
          dVar2 = pow(*distance_local -
                      *(double *)
                       (*(long *)(nodes_local + 0xe) + (long)(*(int *)(xyz_local + 1) * 0xf) * 8),
                      2.0);
          dVar3 = pow(distance_local[1] -
                      *(double *)
                       (*(long *)(nodes_local + 0xe) + (long)(*(int *)(xyz_local + 1) * 0xf + 1) * 8
                       ),2.0);
          local_168 = pow(distance_local[2] -
                          *(double *)
                           (*(long *)(nodes_local + 0xe) +
                           (long)(*(int *)(xyz_local + 1) * 0xf + 2) * 8),2.0);
          local_168 = dVar2 + dVar3 + local_168;
          if (edge_dist1 <= edge_dist0) {
            local_c0 = edge_dist1;
          }
          else {
            local_c0 = edge_dist0;
          }
          if (node_dist0 <= edge_dist2) {
            local_d0 = node_dist0;
          }
          else {
            local_d0 = edge_dist2;
          }
          if (local_d0 <= local_c0) {
            if (node_dist0 <= edge_dist2) {
              local_e8 = node_dist0;
            }
            else {
              local_e8 = edge_dist2;
            }
            local_e0 = local_e8;
          }
          else {
            if (edge_dist1 <= edge_dist0) {
              local_d8 = edge_dist1;
            }
            else {
              local_d8 = edge_dist0;
            }
            local_e0 = local_d8;
          }
          local_100 = local_168;
          if (dVar4 < local_168) {
            local_100 = dVar4;
          }
          local_108 = local_160;
          if (local_100 <= local_160) {
            local_110 = local_168;
            if (dVar4 < local_168) {
              local_110 = dVar4;
            }
            local_108 = local_110;
          }
          if (local_108 <= local_e0) {
            local_158 = local_168;
            if (dVar4 < local_168) {
              local_158 = dVar4;
            }
            if (local_158 <= local_160) {
              if (dVar4 < local_168) {
                local_168 = dVar4;
              }
              local_160 = local_168;
            }
            local_148 = local_160;
          }
          else {
            if (edge_dist1 <= edge_dist0) {
              local_118 = edge_dist1;
            }
            else {
              local_118 = edge_dist0;
            }
            if (node_dist0 <= edge_dist2) {
              local_128 = node_dist0;
            }
            else {
              local_128 = edge_dist2;
            }
            if (local_128 <= local_118) {
              if (node_dist0 <= edge_dist2) {
                local_140 = node_dist0;
              }
              else {
                local_140 = edge_dist2;
              }
              local_138 = local_140;
            }
            else {
              if (edge_dist1 <= edge_dist0) {
                local_130 = edge_dist1;
              }
              else {
                local_130 = edge_dist0;
              }
              local_138 = local_130;
            }
            local_148 = local_138;
          }
          *(double *)projection = local_148;
          ref_node_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xc4f,"ref_node_dist_to_tri",(ulong)uVar1,"e2");
          ref_node_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xc4c,"ref_node_dist_to_tri",(ulong)uVar1,"e1");
        ref_node_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc49,
             "ref_node_dist_to_tri",(ulong)uVar1,"e0");
      ref_node_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc45,
           "ref_node_dist_to_tri",(ulong)uVar1,"proj");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_dist_to_tri(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *xyz, REF_DBL *distance) {
  REF_DBL projection;
  REF_DBL edge_dist0, edge_dist1, edge_dist2;
  REF_DBL node_dist0, node_dist1, node_dist2;
  REF_INT edge_nodes[2];
  RSS(ref_node_tri_projection(ref_node, nodes, xyz, &projection), "proj");
  projection = ABS(projection);
  edge_nodes[0] = nodes[1];
  edge_nodes[1] = nodes[2];
  RSS(ref_node_dist_to_edge(ref_node, edge_nodes, xyz, &edge_dist0), "e0");
  edge_nodes[0] = nodes[2];
  edge_nodes[1] = nodes[0];
  RSS(ref_node_dist_to_edge(ref_node, edge_nodes, xyz, &edge_dist1), "e1");
  edge_nodes[0] = nodes[0];
  edge_nodes[1] = nodes[1];
  RSS(ref_node_dist_to_edge(ref_node, edge_nodes, xyz, &edge_dist2), "e2");
  node_dist0 = pow(xyz[0] - ref_node_xyz(ref_node, 0, nodes[0]), 2) +
               pow(xyz[1] - ref_node_xyz(ref_node, 1, nodes[0]), 2) +
               pow(xyz[2] - ref_node_xyz(ref_node, 2, nodes[0]), 2);
  node_dist1 = pow(xyz[0] - ref_node_xyz(ref_node, 0, nodes[1]), 2) +
               pow(xyz[1] - ref_node_xyz(ref_node, 1, nodes[1]), 2) +
               pow(xyz[2] - ref_node_xyz(ref_node, 2, nodes[1]), 2);
  node_dist2 = pow(xyz[0] - ref_node_xyz(ref_node, 0, nodes[2]), 2) +
               pow(xyz[1] - ref_node_xyz(ref_node, 1, nodes[2]), 2) +
               pow(xyz[2] - ref_node_xyz(ref_node, 2, nodes[2]), 2);
  *distance = MIN(MIN(MIN(projection, edge_dist0), MIN(edge_dist1, edge_dist2)),
                  MIN(node_dist0, MIN(node_dist1, node_dist2)));

  return REF_SUCCESS;
}